

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O3

bool __thiscall QFSFileEngine::supportsExtension(QFSFileEngine *this,Extension extension)

{
  QAbstractFileEnginePrivate *pQVar1;
  char cVar2;
  int iVar3;
  
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  if (extension == FastReadLineExtension) {
    if (pQVar1[3].errorString.d.ptr != (char16_t *)0x0) {
      return true;
    }
    if (*(int *)&pQVar1[3].q_ptr == -1) goto LAB_001498bd;
    iVar3 = (*(this->super_QAbstractFileEngine)._vptr_QAbstractFileEngine[9])();
    cVar2 = (char)iVar3;
  }
  else {
    if ((extension != AtEndExtension) || (pQVar1[3].errorString.d.ptr == (char16_t *)0x0))
    goto LAB_001498bd;
    iVar3 = (*(this->super_QAbstractFileEngine)._vptr_QAbstractFileEngine[9])();
    cVar2 = (char)iVar3;
  }
  if (cVar2 != '\0') {
    return true;
  }
LAB_001498bd:
  return (extension & ~FastReadLineExtension) == MapExtension;
}

Assistant:

bool QFSFileEngine::supportsExtension(Extension extension) const
{
    Q_D(const QFSFileEngine);
    if (extension == AtEndExtension && d->fh && isSequential())
        return true;
    if (extension == FastReadLineExtension && d->fh)
        return true;
    if (extension == FastReadLineExtension && d->fd != -1 && isSequential())
        return true;
    if (extension == UnMapExtension || extension == MapExtension)
        return true;
    return false;
}